

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

void non_temporal_encrypt_v256_cold_1(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar1 = *in_RDI;
  auVar2 = in_RDI[1];
  auVar3 = in_RDI[4] ^ in_RDI[5] ^ auVar1 ^ auVar2 ^ in_RDI[2] ^ in_RDI[3];
  auVar8 = vpslldq_avx(auVar3,8);
  auVar8 = in_RDI[2] ^ in_RDI[3] ^ auVar8;
  auVar7 = vpsrldq_avx(auVar3,8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar8._0_8_;
  auVar3 = (undefined1  [16])0x0;
  for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0xc200000000000000) << uVar4;
    }
  }
  auVar8 = vpshufd_avx(auVar8,0x4e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SUB168(auVar3 ^ auVar8,0);
  auVar5 = (undefined1  [16])0x0;
  for (uVar4 = 0; uVar4 < 0x40; uVar4 = uVar4 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar4) != (undefined1  [16])0x0) {
      auVar5 = auVar5 ^ ZEXT816(0xc200000000000000) << uVar4;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar8,0x4e);
  *(undefined8 *)in_RDI[3] = in_XMM0_Qa;
  *(undefined8 *)(in_RDI[3] + 8) = in_XMM0_Qb;
  in_RDI[2] = auVar5 ^ auVar7 ^ auVar3 ^ auVar1 ^ auVar2;
  return;
}

Assistant:

static inline void gfmul_reduce256(struct ptls_fusion_gfmul_state256 *gstate)
{
#define XOR_256TO128(y) _mm_xor_si128(_mm256_castsi256_si128(y), _mm256_extractf128_si256((y), 1))
    __m128i hi = XOR_256TO128(gstate->hi);
    __m128i lo = XOR_256TO128(gstate->lo);
    __m128i mid = XOR_256TO128(gstate->mid);
#undef XOR_256TO128

    lo = gfmul_do_reduce(hi, lo, mid);
    gstate->lo = _mm256_castsi128_si256(lo);
}